

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloop.cpp
# Opt level: O1

void print_state_instruction(void)

{
  if ((ulong)(uint)state_counter < 5) {
    puts(&DAT_00103018 + *(int *)(&DAT_00103018 + (ulong)(uint)state_counter * 4));
  }
  fflush(_stdout);
  return;
}

Assistant:

void
print_state_instruction()
{
  switch (state_counter) {
  case 0:
    printf("Do LEFT_DOWN in window to make D3 a sibling of D2:\n");
    break;
  case 1:
    printf("Do LEFT_DOWN in window to put D3 back where it was:\n");
    break;
  case 2:
    printf("Do LEFT_DOWN in window to make D2 a top-level window:\n");
    break;
  case 3:
    printf("Do LEFT_DOWN in window to put D2 back where it was:\n");
    break;
  case 4:
    printf("Do LEFT_DOWN in window to exit:\n");
    break;
  }
  fflush(stdout);
}